

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::python::Generator::PrintMessage
          (Generator *this,Descriptor *message_descriptor,string *prefix,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *to_register,bool is_nested)

{
  bool bVar1;
  mapped_type *pmVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  undefined7 in_register_00000081;
  string module_name;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  m;
  string qualified_name;
  allocator local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined1 local_78 [32];
  _Base_ptr local_58;
  size_t local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  if ((int)CONCAT71(in_register_00000081,is_nested) == 0) {
    anon_unknown_0::ResolveKeyword((string *)local_78,*(string **)(message_descriptor + 8));
    std::__cxx11::string::operator=((string *)&local_48,(string *)local_78);
    std::__cxx11::string::~string((string *)local_78);
    io::Printer::Print<char[15],std::__cxx11::string,char[5],std::__cxx11::string>
              (this->printer_,
               "$qualified_name$ = _reflection.GeneratedProtocolMessageType(\'$name$\', (_message.Message,), {\n"
               ,(char (*) [15])"qualified_name",&local_48,(char (*) [5])0x3de831,
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                (message_descriptor + 8));
  }
  else {
    bVar1 = anon_unknown_0::IsPythonKeyword(*(string **)(message_descriptor + 8));
    if (bVar1) {
      std::operator+(&local_98,"getattr(",prefix);
      std::operator+(&local_b8,&local_98,", \'");
      std::operator+(&local_d8,&local_b8,
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      (message_descriptor + 8));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                     &local_d8,"\')");
      std::__cxx11::string::operator=((string *)&local_48,(string *)local_78);
      std::__cxx11::string::~string((string *)local_78);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_b8);
      pbVar3 = &local_98;
    }
    else {
      std::operator+(&local_d8,prefix,".");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                     &local_d8,
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      (message_descriptor + 8));
      std::__cxx11::string::operator=((string *)&local_48,(string *)local_78);
      std::__cxx11::string::~string((string *)local_78);
      pbVar3 = &local_d8;
    }
    std::__cxx11::string::~string((string *)pbVar3);
    io::Printer::Print<char[5],std::__cxx11::string>
              (this->printer_,
               "\'$name$\' : _reflection.GeneratedProtocolMessageType(\'$name$\', (_message.Message,), {\n"
               ,(char (*) [5])0x3de831,
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                (message_descriptor + 8));
  }
  io::Printer::Indent(this->printer_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(to_register,&local_48);
  PrintNestedMessages(this,message_descriptor,&local_48,to_register);
  local_78._24_8_ = local_78 + 8;
  local_78._8_4_ = _S_red;
  local_78._16_8_ = 0;
  local_50 = 0;
  local_58 = (_Base_ptr)local_78._24_8_;
  std::__cxx11::string::string((string *)&local_d8,"descriptor_key",(allocator *)&local_b8);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_78,&local_d8);
  std::__cxx11::string::assign((char *)pmVar2);
  std::__cxx11::string::~string((string *)&local_d8);
  if (this->pure_python_workable_ == true) {
    ModuleLevelDescriptorName<google::protobuf::Descriptor>(&local_d8,this,message_descriptor);
    std::__cxx11::string::string((string *)&local_b8,"descriptor_name",(allocator *)&local_98);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_78,&local_b8);
    pbVar3 = &local_d8;
    std::__cxx11::string::operator=((string *)pmVar2,(string *)pbVar3);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  else {
    std::operator+(&local_b8,"_descriptor.Descriptor(full_name=\'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (*(long *)(message_descriptor + 8) + 0x20));
    std::operator+(&local_d8,&local_b8,"\')");
    std::__cxx11::string::string((string *)&local_98,"descriptor_name",&local_d9);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_78,&local_98);
    std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_d8);
    pbVar3 = &local_b8;
  }
  std::__cxx11::string::~string((string *)pbVar3);
  io::Printer::Print(this->printer_,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_78,"\'$descriptor_key$\' : $descriptor_name$,\n");
  anon_unknown_0::ModuleName(&local_d8,*(string **)this->file_);
  io::Printer::Print<char[12],std::__cxx11::string>
            (this->printer_,"\'__module__\' : \'$module_name$\'\n",(char (*) [12])"module_name",
             &local_d8);
  io::Printer::Print<char[10],std::__cxx11::string>
            (this->printer_,"# @@protoc_insertion_point(class_scope:$full_name$)\n",
             (char (*) [10])0x3e7d3e,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (*(long *)(message_descriptor + 8) + 0x20));
  io::Printer::Print<>(this->printer_,"})\n");
  io::Printer::Outdent(this->printer_);
  std::__cxx11::string::~string((string *)&local_d8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_78);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void Generator::PrintMessage(const Descriptor& message_descriptor,
                             const std::string& prefix,
                             std::vector<std::string>* to_register,
                             bool is_nested) const {
  std::string qualified_name;
  if (is_nested) {
    if (IsPythonKeyword(message_descriptor.name())) {
      qualified_name =
          "getattr(" + prefix + ", '" + message_descriptor.name() + "')";
    } else {
      qualified_name = prefix + "." + message_descriptor.name();
    }
    printer_->Print(
        "'$name$' : _reflection.GeneratedProtocolMessageType('$name$', "
        "(_message.Message,), {\n",
        "name", message_descriptor.name());
  } else {
    qualified_name = ResolveKeyword(message_descriptor.name());
    printer_->Print(
        "$qualified_name$ = _reflection.GeneratedProtocolMessageType('$name$', "
        "(_message.Message,), {\n",
        "qualified_name", qualified_name, "name", message_descriptor.name());
  }
  printer_->Indent();

  to_register->push_back(qualified_name);

  PrintNestedMessages(message_descriptor, qualified_name, to_register);
  std::map<std::string, std::string> m;
  m["descriptor_key"] = kDescriptorKey;
  if (pure_python_workable_) {
    m["descriptor_name"] = ModuleLevelDescriptorName(message_descriptor);
  } else {
    m["descriptor_name"] = "_descriptor.Descriptor(full_name='" +
                           message_descriptor.full_name() + "')";
  }
  printer_->Print(m, "'$descriptor_key$' : $descriptor_name$,\n");
  std::string module_name = ModuleName(file_->name());
  printer_->Print("'__module__' : '$module_name$'\n", "module_name",
                  module_name);
  printer_->Print("# @@protoc_insertion_point(class_scope:$full_name$)\n",
                  "full_name", message_descriptor.full_name());
  printer_->Print("})\n");
  printer_->Outdent();
}